

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_hitroll(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  MOB_INDEX_DATA *pMob;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
  if ((*(char *)&in_RSI->next != '\0') && (bVar2 = is_number(in_stack_ffffffffffffffd8), bVar2)) {
    iVar3 = atoi((char *)in_RSI);
    *(short *)(lVar1 + 0x9c) = (short)iVar3;
    send_to_char(in_RDI,in_RSI);
    return true;
  }
  send_to_char(in_RDI,in_RSI);
  return false;
}

Assistant:

bool medit_hitroll(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;

	EDIT_MOB(ch, pMob);

	if (argument[0] == '\0' || !is_number(argument))
	{
		send_to_char("Syntax:  hitroll [number]\n\r", ch);
		return false;
	}

	pMob->hitroll = atoi(argument);
	send_to_char("Hitroll set.\n\r", ch);
	return true;
}